

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

void ikcp_parse_fastack(ikcpcb *kcp,IUINT32 sn,IUINT32 ts)

{
  IQUEUEHEAD *pIVar1;
  IKCPSEG *seg;
  IQUEUEHEAD *next;
  IQUEUEHEAD *p;
  IUINT32 ts_local;
  IUINT32 sn_local;
  ikcpcb *kcp_local;
  
  if ((-1 < (int)(sn - kcp->snd_una)) && ((int)(sn - kcp->snd_nxt) < 0)) {
    pIVar1 = (kcp->snd_buf).next;
    while ((next = pIVar1, next != &kcp->snd_buf &&
           (pIVar1 = next->next, -1 < (int)(sn - *(int *)((long)&next[2].next + 4))))) {
      if (sn != *(IUINT32 *)((long)&next[2].next + 4)) {
        *(int *)&next[3].prev = *(int *)&next[3].prev + 1;
      }
    }
  }
  return;
}

Assistant:

static void ikcp_parse_fastack(ikcpcb *kcp, IUINT32 sn, IUINT32 ts)
{
	struct IQUEUEHEAD *p, *next;

	if (_itimediff(sn, kcp->snd_una) < 0 || _itimediff(sn, kcp->snd_nxt) >= 0)
		return;

	for (p = kcp->snd_buf.next; p != &kcp->snd_buf; p = next) {
		IKCPSEG *seg = iqueue_entry(p, IKCPSEG, node);
		next = p->next;
		if (_itimediff(sn, seg->sn) < 0) {
			break;
		}
		else if (sn != seg->sn) {
		#ifndef IKCP_FASTACK_CONSERVE
			seg->fastack++;
		#else
			if (_itimediff(ts, seg->ts) >= 0)
				seg->fastack++;
		#endif
		}
	}
}